

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O3

void __thiscall
AdaptorTest_QueueTest_Test::~AdaptorTest_QueueTest_Test(AdaptorTest_QueueTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AdaptorTest, QueueTest) {
    std::queue<int, Deque<int>> q;
    for (int i = 0; i < 100; ++i) {
        q.push(i);
    }

    for (int i = 0; i < 100; ++i) {
        ASSERT_FALSE(q.empty());
        ASSERT_EQ(q.front(), i);
        q.pop();
    }
}